

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retnode.cpp
# Opt level: O0

void __thiscall RetNode::print(RetNode *this)

{
  ostream *poVar1;
  pointer pAVar2;
  RetNode *this_local;
  
  poVar1 = (ostream *)std::ostream::operator<<(&std::cout,(this->super_ASTNode).currentNode);
  poVar1 = std::operator<<(poVar1,";");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = (ostream *)std::ostream::operator<<(&std::cout,(this->super_ASTNode).currentNode);
  poVar1 = std::operator<<(poVar1,"[label=\"Ret\"];");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = (ostream *)std::ostream::operator<<(&std::cout,(this->super_ASTNode).currentNode);
  std::operator<<(poVar1,"--");
  pAVar2 = std::unique_ptr<ASTNode,_std::default_delete<ASTNode>_>::operator->(&this->toReturn);
  (*pAVar2->_vptr_ASTNode[4])();
  return;
}

Assistant:

void RetNode::print() {
    std::cout << currentNode << ";" << std::endl;
    std::cout << currentNode << "[label=\"Ret\"];" << std::endl;
    std::cout << currentNode << "--"; toReturn->print();
}